

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_astDownCastNode_addOntoNodeWithTargetType
          (sysbvm_context_t *context,sysbvm_tuple_t valueExpression,sysbvm_tuple_t targetType)

{
  sysbvm_tuple_t typeExpression;
  sysbvm_tuple_t sVar1;
  
  if ((valueExpression & 0xf) == 0 && valueExpression != 0) {
    sVar1 = *(sysbvm_tuple_t *)(valueExpression + 0x10);
  }
  else {
    sVar1 = 0;
  }
  typeExpression = sysbvm_astLiteralNode_create(context,sVar1,targetType);
  sVar1 = sysbvm_astDownCastNode_create(context,sVar1,typeExpression,valueExpression);
  return sVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_astDownCastNode_addOntoNodeWithTargetType(sysbvm_context_t *context, sysbvm_tuple_t valueExpression, sysbvm_tuple_t targetType)
{
    sysbvm_tuple_t sourcePosition = sysbvm_astNode_getSourcePosition(valueExpression);
    sysbvm_tuple_t targetTypeExpression = sysbvm_astLiteralNode_create(context, sourcePosition, targetType);
    return sysbvm_astDownCastNode_create(context, sourcePosition, targetTypeExpression, valueExpression);
}